

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_selected_tx_size(MACROBLOCKD *xd,aom_writer *w)

{
  BLOCK_SIZE bsize_00;
  int iVar1;
  int symb;
  int iVar2;
  long in_RDI;
  int32_t tx_size_cat;
  int max_depths;
  int depth;
  int tx_size_ctx;
  TX_SIZE tx_size;
  FRAME_CONTEXT *ec_ctx;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  MACROBLOCKD *xd_00;
  
  xd_00 = (MACROBLOCKD *)**(long **)(in_RDI + 0x1eb8);
  bsize_00 = (BLOCK_SIZE)xd_00->mi_row;
  iVar1 = block_signals_txsize(bsize_00);
  if (iVar1 != 0) {
    uVar3 = CONCAT13(*(undefined1 *)((long)xd_00->plane[0].seg_dequant_QTX[0] + 1),
                     (int3)in_stack_ffffffffffffffd4);
    iVar1 = get_tx_size_context(xd_00);
    symb = tx_size_to_depth((TX_SIZE)((uint)uVar3 >> 0x18),bsize_00);
    bsize_to_max_depth(bsize_00);
    iVar2 = bsize_to_tx_size_cat(bsize_00);
    aom_write_symbol((aom_writer *)CONCAT44(uVar3,iVar1),symb,
                     (aom_cdf_prob *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

static inline void write_selected_tx_size(const MACROBLOCKD *xd,
                                          aom_writer *w) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  if (block_signals_txsize(bsize)) {
    const TX_SIZE tx_size = mbmi->tx_size;
    const int tx_size_ctx = get_tx_size_context(xd);
    const int depth = tx_size_to_depth(tx_size, bsize);
    const int max_depths = bsize_to_max_depth(bsize);
    const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);

    assert(depth >= 0 && depth <= max_depths);
    assert(!is_inter_block(mbmi));
    assert(IMPLIES(is_rect_tx(tx_size), is_rect_tx_allowed(xd, mbmi)));

    aom_write_symbol(w, depth, ec_ctx->tx_size_cdf[tx_size_cat][tx_size_ctx],
                     max_depths + 1);
  }
}